

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void dump<float>(char *name,float *frames,size_t count)

{
  size_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  FILE *file;
  char *in_stack_ffffffffffffffd8;
  FILE *in_stack_ffffffffffffffe0;
  
  fopen_portable((FILE **)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)0x10e269);
  if (in_stack_ffffffffffffffe0 == (FILE *)0x0) {
    fprintf(_stderr,"error opening %s\n",in_RDI);
  }
  else {
    sVar1 = fwrite(in_RSI,4,in_RDX,in_stack_ffffffffffffffe0);
    if (in_RDX != sVar1) {
      fprintf(_stderr,"error writing to %s\n",in_RDI);
    }
    fclose(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void dump(const char * name, T * frames, size_t count)
{
  FILE * file;
  fopen_portable(&file, name, "wb");

  if (!file) {
    fprintf(stderr, "error opening %s\n", name);
    return;
  }

  if (count != fwrite(frames, sizeof(T), count, file)) {
    fprintf(stderr, "error writing to %s\n", name);
  }
  fclose(file);
}